

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPParser.cpp
# Opt level: O1

void __thiscall MADPParser::Parse(MADPParser *this,FactoredDecPOMDPDiscrete *model)

{
  ParserProbModelXML parser;
  ParserProbModelXML local_110;
  
  ParserProbModelXML::ParserProbModelXML(&local_110,model);
  ParserProbModelXML::Parse(&local_110);
  local_110.super_ParserInterface._vptr_ParserInterface =
       (_func_int **)&PTR__ParserProbModelXML_005cfcb0;
  if (local_110._m_ASizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110._m_ASizes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110._m_ASizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110._m_ASizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_110._m_ANames);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_110._m_AScopes_LRF);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_110._m_AScopes_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&local_110._m_AScopes_Y);
  std::
  _Rb_tree<_xmlNode_*,_std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>,_std::_Select1st<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
  ::~_Rb_tree(&local_110._m_arrayCache._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
  ::~_Rb_tree(&local_110._m_parsedElements._M_t);
  return;
}

Assistant:

void MADPParser::Parse(FactoredDecPOMDPDiscrete *model)
{
    ParserProbModelXML parser(model);
    parser.Parse();
}